

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

void __thiscall duckdb::WindowHashGroup::MaterializeSortedData(WindowHashGroup *this)

{
  BufferManager *pBVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::SortedData_*,_false> _Var3;
  int iVar4;
  pointer this_00;
  type pGVar5;
  reference this_01;
  type this_02;
  reference pvVar6;
  pointer pRVar7;
  pointer pRVar8;
  pointer pRVar9;
  undefined4 extraout_var;
  idx_t iVar10;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *puVar11;
  pointer puVar12;
  bool local_61;
  _Head_base<0UL,_duckdb::SortedData_*,_false> local_60;
  BufferManager *local_58;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_50;
  type local_48;
  uint local_3c;
  unsigned_long local_38;
  
  this_00 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
            ::operator->(&this->hash_group);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(&this_00->global_sort);
  if ((pGVar5->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pGVar5->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar10 = 0;
    this_01 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::get<true>(&pGVar5->sorted_blocks,0);
    this_02 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator*(this_01);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::clear((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             *)this_02);
    local_60._M_head_impl = (SortedData *)0x0;
    ::std::__uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>::reset
              ((__uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> *)
               &this_02->blob_sorting_data,(pointer)0x0);
    ::std::unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>::~unique_ptr
              ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> *)&local_60
              );
    pBVar1 = pGVar5->buffer_manager;
    local_48 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator*(&this_02->payload_data);
    local_50 = &local_48->data_blocks;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>(local_50,0);
    pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar6);
    pRVar8 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar6);
    local_58 = pBVar1;
    make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long&,unsigned_long_const&>
              ((duckdb *)&local_60,pBVar1,&pRVar7->capacity,&pRVar8->entry_size);
    _Var3._M_head_impl = local_60._M_head_impl;
    puVar11 = &this->rows;
    local_60._M_head_impl = (SortedData *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)puVar11,(pointer)_Var3._M_head_impl);
    ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                 *)&local_60);
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::_M_move_assign(&(pRVar9->blocks).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    );
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    puVar12 = (pRVar9->blocks).
              super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    puVar2 = (pRVar9->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (; puVar12 != puVar2; puVar12 = puVar12 + 1) {
      pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(puVar12);
      iVar10 = iVar10 + pRVar7->count;
    }
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    pBVar1 = local_58;
    pRVar9->count = iVar10;
    if ((local_48->heap_blocks).
        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_48->heap_blocks).
        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar4 = (*local_58->_vptr_BufferManager[0xf])(local_58);
      local_38 = CONCAT44(extraout_var,iVar4);
      local_3c = 1;
      local_61 = true;
      make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long,unsigned_int,bool>
                ((duckdb *)&local_60,pBVar1,&local_38,&local_3c,&local_61);
      _Var3._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (SortedData *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
      reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
             *)&this->heap,(pointer)_Var3._M_head_impl);
      ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ::~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                     *)&local_60);
    }
    else {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(&local_48->heap_blocks,0);
      pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar6);
      pRVar8 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar6);
      make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long&,unsigned_long_const&>
                ((duckdb *)&local_60,local_58,&pRVar7->capacity,&pRVar8->entry_size);
      _Var3._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (SortedData *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
      reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
             *)&this->heap,(pointer)_Var3._M_head_impl);
      ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ::~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                     *)&local_60);
      pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
               ::operator->(&this->heap);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::_M_move_assign(&(pRVar9->blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      );
      ::std::
      __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      ::reset((__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               *)this,(pointer)0x0);
    }
    puVar11 = &this->heap;
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    puVar12 = (pRVar9->blocks).
              super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    puVar2 = (pRVar9->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar10 = 0;
    for (; puVar12 != puVar2; puVar12 = puVar12 + 1) {
      pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(puVar12);
      iVar10 = iVar10 + pRVar7->count;
    }
    pRVar9 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(puVar11);
    pRVar9->count = iVar10;
  }
  return;
}

Assistant:

void WindowHashGroup::MaterializeSortedData() {
	auto &global_sort_state = *hash_group->global_sort;
	if (global_sort_state.sorted_blocks.empty()) {
		return;
	}

	// scan the sorted row data
	D_ASSERT(global_sort_state.sorted_blocks.size() == 1);
	auto &sb = *global_sort_state.sorted_blocks[0];

	// Free up some memory before allocating more
	sb.radix_sorting_data.clear();
	sb.blob_sorting_data = nullptr;

	// Move the sorting row blocks into our RDCs
	auto &buffer_manager = global_sort_state.buffer_manager;
	auto &sd = *sb.payload_data;

	// Data blocks are required
	D_ASSERT(!sd.data_blocks.empty());
	auto &block = sd.data_blocks[0];
	rows = make_uniq<RowDataCollection>(buffer_manager, block->capacity, block->entry_size);
	rows->blocks = std::move(sd.data_blocks);
	rows->count = std::accumulate(rows->blocks.begin(), rows->blocks.end(), idx_t(0),
	                              [&](idx_t c, const unique_ptr<RowDataBlock> &b) { return c + b->count; });

	// Heap blocks are optional, but we want both for iteration.
	if (!sd.heap_blocks.empty()) {
		auto &block = sd.heap_blocks[0];
		heap = make_uniq<RowDataCollection>(buffer_manager, block->capacity, block->entry_size);
		heap->blocks = std::move(sd.heap_blocks);
		hash_group.reset();
	} else {
		heap = make_uniq<RowDataCollection>(buffer_manager, buffer_manager.GetBlockSize(), 1U, true);
	}
	heap->count = std::accumulate(heap->blocks.begin(), heap->blocks.end(), idx_t(0),
	                              [&](idx_t c, const unique_ptr<RowDataBlock> &b) { return c + b->count; });
}